

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CaseInsensitive.cpp
# Opt level: O2

void __thiscall
UnifiedRegex::CaseInsensitive::Transform::Apply<char16_t>(Transform *this,uint c,char16_t *outEquiv)

{
  code *pcVar1;
  bool bVar2;
  Char CVar3;
  uint uVar4;
  undefined4 *puVar5;
  int iVar6;
  
  uVar4 = this->lo;
  if ((c < uVar4) || (this->hi < c)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CaseInsensitive.cpp"
                       ,0x29,"(c >= lo && c <= hi)","c >= lo && c <= hi");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar5 = 0;
    uVar4 = this->lo;
  }
  iVar6 = 0;
  if ((uVar4 + 1) % (uint)this->skipCountOfRange == c % (uint)this->skipCountOfRange) {
    iVar6 = this->delta0;
  }
  CVar3 = Chars<char16_t>::UTC(iVar6 + c);
  *outEquiv = CVar3;
  if (this->lo % (uint)this->skipCountOfRange == c % (uint)this->skipCountOfRange) {
    CVar3 = Chars<char16_t>::ITC(this->delta1 + c);
    outEquiv[1] = CVar3;
    CVar3 = Chars<char16_t>::ITC(this->delta2 + c);
    outEquiv[2] = CVar3;
    CVar3 = Chars<char16_t>::ITC(c + this->delta3);
  }
  else {
    CVar3 = Chars<char16_t>::UTC(c);
    outEquiv[2] = CVar3;
    outEquiv[1] = CVar3;
  }
  outEquiv[3] = CVar3;
  return;
}

Assistant:

inline void Apply(uint c, Char outEquiv[EquivClassSize]) const
            {
                Assert(c >= lo && c <= hi);

                outEquiv[0] = Chars<Char>::UTC((lo + 1) % skipCountOfRange == c % skipCountOfRange ? (int)c + delta0 : c);

                CompileAssert(CaseInsensitive::EquivClassSize == 4);
                if (lo  % skipCountOfRange == c % skipCountOfRange)
                {
                    outEquiv[1] = Chars<Char>::ITC((int)c + delta1);
                    outEquiv[2] = Chars<Char>::ITC((int)c + delta2);
                    outEquiv[3] = Chars<Char>::ITC((int)c + delta3);
                }
                else
                {
                    outEquiv[1] = outEquiv[2] = outEquiv[3] = Chars<Char>::UTC(c);
                }
            }